

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O0

void __thiscall di::Context::addInstance<T1_B>(Context *this,T1_B *instance,bool takeOwnership)

{
  runtime_error *prVar1;
  _func_void_void_ptr *p_Var2;
  mapped_type *local_d8;
  _lambda_void___1_ local_cb;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  type_index local_88;
  mapped_type *local_80;
  CtxItem *item;
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  byte local_19;
  T1_B *pTStack_18;
  bool takeOwnership_local;
  T1_B *instance_local;
  Context *this_local;
  
  local_19 = takeOwnership;
  pTStack_18 = instance;
  instance_local = (T1_B *)this;
  if (instance == (T1_B *)0x0) {
    item._3_1_ = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Trying to add nullptr instance for type: ",&local_61);
    std::type_info::name((type_info *)&T1_B::typeinfo);
    std::operator+(local_40,(char *)local_60);
    std::runtime_error::runtime_error(prVar1,(string *)local_40);
    item._3_1_ = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::type_index::type_index(&local_88,(type_info *)&T1_B::typeinfo);
  local_80 = std::
             map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
             ::operator[](&this->items,&local_88);
  if (local_80->instancePtr != (void *)0x0) {
    local_ca = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Instance already in Context for type: ",&local_c9);
    std::type_info::name((type_info *)&T1_B::typeinfo);
    std::operator+(local_a8,(char *)local_c8);
    std::runtime_error::runtime_error(prVar1,(string *)local_a8);
    local_ca = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_80->instancePtr = pTStack_18;
  if ((local_19 & 1) != 0) {
    p_Var2 = addInstance(T1_B*,bool)::{lambda(void*)#1}::operator_cast_to_function_pointer
                       (&local_cb);
    local_80->deleter = p_Var2;
    local_d8 = local_80;
    std::vector<di::Context::CtxItem_*,_std::allocator<di::Context::CtxItem_*>_>::push_back
              (&this->constructionOrder,&local_d8);
  }
  return;
}

Assistant:

void addInstance(T* instance, bool takeOwnership = false)
    {
        if (instance == nullptr)
            throw std::runtime_error(std::string("Trying to add nullptr instance for type: ") + typeid(T).name());

        CtxItem& item = items[ std::type_index(typeid(T)) ];

        if (item.instancePtr != nullptr)
            throw std::runtime_error(std::string("Instance already in Context for type: ") + typeid(T).name());

        item.instancePtr = static_cast<void*>(instance);

        if (takeOwnership)
        {
            item.deleter = [](void* ptr) { delete( static_cast<T*>(ptr) ); };
            constructionOrder.push_back(&item);
        }
    }